

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

string * __thiscall
duckdb::CastExceptionText<duckdb::string_t,signed_char>
          (string *__return_storage_ptr__,duckdb *this,string_t input)

{
  size_type *psVar1;
  ulong uVar2;
  long lVar3;
  string_t input_00;
  long *plVar4;
  undefined8 *puVar5;
  string *extraout_RAX;
  string *psVar6;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined8 in_stack_ffffffffffffff68;
  ulong *puVar11;
  ulong local_88;
  long lStack_80;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string *local_38 [4];
  
  input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff68;
  input_00.value._0_8_ = 0x12c87b2;
  ConvertToString::Operation<duckdb::string_t>(input_00);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x1dbc7b4);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_48 = *plVar7;
    lStack_40 = plVar4[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar7;
    local_58 = (long *)*plVar4;
  }
  local_50 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_58);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_88 = *puVar8;
    lStack_80 = plVar4[3];
    puVar11 = &local_88;
  }
  else {
    local_88 = *puVar8;
    puVar11 = (ulong *)*plVar4;
  }
  lVar3 = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  TypeIdToString_abi_cxx11_(&local_78,(duckdb *)0x3,(PhysicalType)lVar3);
  uVar2 = local_78._M_string_length + lVar3;
  uVar9 = 0xf;
  if (puVar11 != &local_88) {
    uVar9 = local_88;
  }
  if (uVar9 < uVar2) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar10 = local_78.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)puVar11);
      goto LAB_012c88d1;
    }
  }
  puVar5 = (undefined8 *)
           ::std::__cxx11::string::_M_append
                     (&stack0xffffffffffffff68,(ulong)local_78._M_dataplus._M_p);
LAB_012c88d1:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar10 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (puVar11 != &local_88) {
    operator_delete(puVar11);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  psVar6 = (string *)(local_38 + 2);
  if (local_38[0] != psVar6) {
    operator_delete(local_38[0]);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}